

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dbl.c
# Opt level: O3

arg_dbl * arg_dbln(char *shortopts,char *longopts,char *datatype,int mincount,int maxcount,
                  char *glossary)

{
  arg_dbl *paVar1;
  char *pcVar2;
  
  if (maxcount <= mincount) {
    maxcount = mincount;
  }
  paVar1 = (arg_dbl *)argtable3_xmalloc((long)maxcount * 8 + 0x78);
  (paVar1->hdr).flag = '\x02';
  (paVar1->hdr).shortopts = shortopts;
  pcVar2 = "<double>";
  if (datatype != (char *)0x0) {
    pcVar2 = datatype;
  }
  (paVar1->hdr).longopts = longopts;
  (paVar1->hdr).datatype = pcVar2;
  (paVar1->hdr).glossary = glossary;
  (paVar1->hdr).mincount = mincount;
  (paVar1->hdr).maxcount = maxcount;
  (paVar1->hdr).parent = paVar1;
  (paVar1->hdr).resetfn = arg_dbl_resetfn;
  (paVar1->hdr).scanfn = arg_dbl_scanfn;
  (paVar1->hdr).checkfn = arg_dbl_checkfn;
  (paVar1->hdr).errorfn = arg_dbl_errorfn;
  paVar1->dval = (double *)(((ulong)(paVar1 + 1) & 0xfffffffffffffff8) + 8);
  paVar1->count = 0;
  return paVar1;
}

Assistant:

struct arg_dbl* arg_dbln(const char* shortopts, const char* longopts, const char* datatype, int mincount, int maxcount, const char* glossary) {
    size_t nbytes;
    struct arg_dbl* result;
    size_t addr;
    size_t rem;

    /* foolproof things by ensuring maxcount is not less than mincount */
    maxcount = (maxcount < mincount) ? mincount : maxcount;

    nbytes = sizeof(struct arg_dbl)             /* storage for struct arg_dbl */
             + (size_t)(maxcount + 1) * sizeof(double); /* storage for dval[maxcount] array plus one extra for padding to memory boundary */

    result = (struct arg_dbl*)xmalloc(nbytes);

    /* init the arg_hdr struct */
    result->hdr.flag = ARG_HASVALUE;
    result->hdr.shortopts = shortopts;
    result->hdr.longopts = longopts;
    result->hdr.datatype = datatype ? datatype : "<double>";
    result->hdr.glossary = glossary;
    result->hdr.mincount = mincount;
    result->hdr.maxcount = maxcount;
    result->hdr.parent = result;
    result->hdr.resetfn = (arg_resetfn*)arg_dbl_resetfn;
    result->hdr.scanfn = (arg_scanfn*)arg_dbl_scanfn;
    result->hdr.checkfn = (arg_checkfn*)arg_dbl_checkfn;
    result->hdr.errorfn = (arg_errorfn*)arg_dbl_errorfn;

    /* Store the dval[maxcount] array on the first double boundary that
     * immediately follows the arg_dbl struct. We do the memory alignment
     * purely for SPARC and Motorola systems. They require floats and
     * doubles to be aligned on natural boundaries.
     */
    addr = (size_t)(result + 1);
    rem = addr % sizeof(double);
    result->dval = (double*)(addr + sizeof(double) - rem);
    ARG_TRACE(("addr=%p, dval=%p, sizeof(double)=%d rem=%d\n", addr, result->dval, (int)sizeof(double), (int)rem));

    result->count = 0;

    ARG_TRACE(("arg_dbln() returns %p\n", result));
    return result;
}